

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpression<const_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&,_(Catch::Internal::Operator)0,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&>
::reconstructExpression
          (BinaryExpression<const_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&,_(Catch::Internal::Operator)0,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&>
           *this,string *dest)

{
  char cVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
  *in_RDX;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
  *value;
  bool bVar5;
  char delim;
  undefined1 local_58 [8];
  string rhs;
  string lhs;
  string *dest_local;
  BinaryExpression<const_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&,_(Catch::Internal::Operator)0,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>_&>
  *this_local;
  
  toString<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>,false,true>>
            ((string *)((long)&rhs.field_2 + 8),(Catch *)this->m_lhs,in_RDX);
  toString<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,unsigned_long>,false,true>>
            ((string *)local_58,(Catch *)this->m_rhs,value);
  lVar2 = std::__cxx11::string::size();
  lVar3 = std::__cxx11::string::size();
  bVar5 = false;
  if ((ulong)(lVar2 + lVar3) < 0x28) {
    lVar2 = std::__cxx11::string::find((char)&rhs + '\x18',10);
    bVar5 = false;
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char)local_58,10);
      bVar5 = lVar2 == -1;
    }
  }
  cVar1 = '\n';
  if (bVar5) {
    cVar1 = ' ';
  }
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)dest);
  std::__cxx11::string::operator=((string *)dest,(string *)(rhs.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)dest,cVar1);
  pcVar4 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::__cxx11::string::operator+=((string *)dest,pcVar4);
  std::__cxx11::string::operator+=((string *)dest,cVar1);
  std::__cxx11::string::operator+=((string *)dest,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(rhs.field_2._M_local_buf + 8));
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        std::string lhs = Catch::toString( m_lhs );
        std::string rhs = Catch::toString( m_rhs );
        char delim = lhs.size() + rhs.size() < 40 &&
                     lhs.find('\n') == std::string::npos &&
                     rhs.find('\n') == std::string::npos ? ' ' : '\n';
        dest.reserve( 7 + lhs.size() + rhs.size() );
                   // 2 for spaces around operator
                   // 2 for operator
                   // 2 for parentheses (conditionally added later)
                   // 1 for negation (conditionally added later)
        dest = lhs;
        dest += delim;
        dest += Internal::OperatorTraits<Op>::getName();
        dest += delim;
        dest += rhs;
    }